

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_utils.cpp
# Opt level: O0

u8 tg::getNumChannels(u32 format)

{
  u8 local_9;
  u32 format_local;
  
  if (format == 0x1903) {
    return '\x01';
  }
  if (format == 0x1907) {
LAB_00149be2:
    local_9 = '\x03';
  }
  else {
    if (format != 0x1908) {
      if (format == 0x80e0) goto LAB_00149be2;
      if (format != 0x80e1) {
        if (format == 0x8227) {
          return '\x02';
        }
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tg/texture_utils.cpp"
                      ,0x1d4,"u8 tg::getNumChannels(u32)");
      }
    }
    local_9 = '\x04';
  }
  return local_9;
}

Assistant:

u8 getNumChannels(u32 format)
{
    switch(format)
    {
    case GL_RED:
        return 1;
    case GL_RG:
        return 2;
    case GL_RGB:
    case GL_BGR:
            return 3;
    case GL_RGBA:
    case GL_BGRA:
        return 4;
    // There are many more but I'm lazy
    }
    assert(false);
    return 0;
}